

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cpp
# Opt level: O2

bool wallet::VerifyWallets(WalletContext *context)

{
  long lVar1;
  string_view source_file;
  string arg;
  string str;
  string original;
  UniValue val;
  bool bVar2;
  char cVar3;
  ArgsManager **ppAVar4;
  Logger *pLVar5;
  bilingual_str *fmt;
  char *this;
  UniValue *this_00;
  long in_FS_OFFSET;
  undefined1 uVar6;
  pair<std::_Rb_tree_iterator<fs::path>,_bool> pVar7;
  string_view logging_function;
  string_view str_00;
  undefined8 in_stack_fffffffffffffd18;
  char *in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  Chain *pCVar8;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  undefined8 in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  ArgsManager *this_01;
  undefined8 in_stack_fffffffffffffd58;
  UniValue *pUVar9;
  undefined1 in_stack_fffffffffffffd60 [16];
  DatabaseStatus status;
  set<fs::path,_std::less<fs::path>,_std::allocator<fs::path>_> wallet_paths;
  UniValue local_220;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8 [16];
  SettingsValue wallets;
  path wallet_dir;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  string log_msg;
  undefined1 local_e0 [24];
  int64_t local_c8;
  DatabaseStatus status_1;
  path local_a0;
  undefined1 local_78 [32];
  error_code error;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar8 = context->chain;
  this = "VerifyWallets";
  ppAVar4 = inline_assertion_check<true,ArgsManager*&>
                      (&context->args,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/load.cpp"
                       ,0x1e,"VerifyWallets","context.args");
  this_01 = *ppAVar4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wallets,"-walletdir",(allocator<char> *)&log_msg);
  bVar2 = ArgsManager::IsArgSet(this_01,(string *)&wallets);
  std::__cxx11::string::~string((string *)&wallets);
  if (!bVar2) {
LAB_001c816f:
    GetWalletDir();
    std::filesystem::__cxx11::path::string((string *)&status_1,(path *)&wallets);
    pLVar5 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar5);
    if (bVar2) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_allocated_capacity =
           log_msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
      tinyformat::format<std::__cxx11::string>
                ((string *)&wallet_dir,(tinyformat *)"Using wallet directory %s\n",(char *)&status_1
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &wallet_dir);
      std::__cxx11::string::~string((string *)&wallet_dir);
      pLVar5 = LogInstance();
      wallet_dir.super_path._M_pathname._M_dataplus._M_p = (pointer)0x58;
      wallet_dir.super_path._M_pathname._M_string_length = (size_type)anon_var_dwarf_4ba890;
      in_stack_fffffffffffffd18 = 0x58;
      in_stack_fffffffffffffd20 =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/load.cpp"
      ;
      in_stack_fffffffffffffd30 = 2;
      in_stack_fffffffffffffd28 = 0xffffffffffffffff;
      this = (char *)0xd;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/load.cpp"
      ;
      source_file._M_len = 0x58;
      logging_function._M_str = "VerifyWallets";
      logging_function._M_len = 0xd;
      str_00._M_str = log_msg._M_dataplus._M_p;
      str_00._M_len = log_msg._M_string_length;
      BCLog::Logger::LogPrintStr(pLVar5,str_00,logging_function,source_file,0x35,ALL,Info);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    std::__cxx11::string::~string((string *)&status_1);
    std::filesystem::__cxx11::path::~path((path *)&wallets);
    _((bilingual_str *)&wallets,(ConstevalStringLiteral)0x3fa746);
    (**(code **)(*(long *)pCVar8 + 0x128))(pCVar8,(undefined1 *)((long)&wallets.val.field_2 + 8));
    bilingual_str::~bilingual_str((bilingual_str *)&wallets);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&wallets,"wallet",(allocator<char> *)&log_msg);
    bVar2 = ArgsManager::IsArgSet(this_01,(string *)&wallets);
    std::__cxx11::string::~string((string *)&wallets);
    if (!bVar2) {
      log_msg._M_dataplus._M_p = log_msg._M_dataplus._M_p & 0xffffffffffff0000;
      log_msg._M_string_length = log_msg._M_string_length & 0xffffffffffffff00;
      log_msg.field_2._M_allocated_capacity = 0;
      log_msg.field_2._8_8_ = local_e0;
      local_e0._0_8_ = local_e0._0_8_ & 0xffffffffffffff00;
      local_e0._16_2_ = 1;
      local_e0[0x12] = false;
      local_c8 = 100;
      ReadDatabaseArgs(this_01,(DatabaseOptions *)&log_msg);
      wallet_dir.super_path._M_pathname._M_dataplus._M_p =
           (pointer)&wallet_dir.super_path._M_pathname.field_2;
      wallet_dir.super_path._M_pathname._M_string_length = 0;
      wallet_dir.super_path._M_pathname.field_2._M_local_buf[0] = '\0';
      wallet_dir.super_path._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )&local_118;
      local_118._M_local_buf[0] = '\0';
      log_msg._M_dataplus._M_p._0_1_ = 1;
      local_e0._16_2_ = local_e0._16_2_ & 0xff00;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&wallets,"",(allocator<char> *)&error);
      this = (char *)&status;
      MakeWalletDatabase((wallet *)&wallet_paths,(string *)&wallets,(DatabaseOptions *)&log_msg,
                         (DatabaseStatus *)this,(bilingual_str *)&wallet_dir);
      if (wallet_paths._M_t._M_impl._0_8_ == 0) {
        wallet_paths._M_t._M_impl._0_8_ = 0;
        std::__cxx11::string::~string((string *)&wallets);
      }
      else {
        (**(code **)(*(long *)wallet_paths._M_t._M_impl._0_8_ + 8))();
        wallet_paths._M_t._M_impl._0_8_ = 0;
        std::__cxx11::string::~string((string *)&wallets);
        local_1c8 = local_1b8;
        local_1c0 = 0;
        local_1b8[0] = 0;
        str._M_string_length = (size_type)in_stack_fffffffffffffd20;
        str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd18;
        str.field_2._M_allocated_capacity = in_stack_fffffffffffffd28;
        str.field_2._8_4_ = in_stack_fffffffffffffd30;
        str.field_2._12_4_ = in_stack_fffffffffffffd34;
        UniValue::UniValue(&wallets,VARR,str);
        std::__cxx11::string::~string((string *)&local_1c8);
        UniValue::UniValue<const_char_(&)[1],_char[1],_true>(&local_220,(char (*) [1])0x42e0a1);
        val.val._M_dataplus._M_p = in_stack_fffffffffffffd20;
        val._0_8_ = in_stack_fffffffffffffd18;
        val.val._M_string_length = in_stack_fffffffffffffd28;
        val.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffd30;
        val.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffd34;
        val.val.field_2._8_8_ = pCVar8;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffffd40;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffffd44;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd48;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd50;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd58;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd60._0_8_;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd60._8_8_;
        UniValue::push_back(&wallets,val);
        UniValue::~UniValue(&local_220);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&wallet_paths,"wallet",(allocator<char> *)&error);
        this = (char *)0x0;
        (**(code **)(*(long *)pCVar8 + 400))(pCVar8,&wallet_paths,&wallets);
        std::__cxx11::string::~string((string *)&wallet_paths);
        UniValue::~UniValue(&wallets);
      }
      bilingual_str::~bilingual_str((bilingual_str *)&wallet_dir);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
                    ((long)&log_msg.field_2 + 8));
    }
    wallet_paths._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &wallet_paths._M_t._M_impl.super__Rb_tree_header._M_header;
    wallet_paths._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    wallet_paths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    wallet_paths._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    wallet_paths._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         wallet_paths._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&wallets,"wallet",(allocator<char> *)&log_msg);
    (**(code **)(*(long *)pCVar8 + 0x178))(&error,pCVar8,&wallets);
    std::__cxx11::string::~string((string *)&wallets);
    pUVar9 = (UniValue *)error._M_cat;
    for (this_00 = (UniValue *)CONCAT44(error._4_4_,error._M_value); uVar6 = this_00 == pUVar9,
        !(bool)uVar6; this_00 = this_00 + 1) {
      if (this_00->typ != VSTR) {
        _((bilingual_str *)&wallets,(ConstevalStringLiteral)0x3fa75d);
        (**(code **)(*(long *)pCVar8 + 0x138))(pCVar8,&wallets);
        bilingual_str::~bilingual_str((bilingual_str *)&wallets);
        break;
      }
      fmt = (bilingual_str *)UniValue::get_str_abi_cxx11_(this_00);
      GetWalletDir();
      fs::PathFromString((path *)&log_msg,(string *)fmt);
      fsbridge::AbsPathJoin((path *)&status,(path *)&wallets,(path *)&log_msg);
      std::filesystem::__cxx11::path::~path((path *)&log_msg);
      std::filesystem::__cxx11::path::~path((path *)&wallets);
      pVar7 = std::
              _Rb_tree<fs::path,fs::path,std::_Identity<fs::path>,std::less<fs::path>,std::allocator<fs::path>>
              ::_M_insert_unique<fs::path_const&>
                        ((_Rb_tree<fs::path,fs::path,std::_Identity<fs::path>,std::less<fs::path>,std::allocator<fs::path>>
                          *)&wallet_paths,(path *)&status);
      if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        _((bilingual_str *)&log_msg,(ConstevalStringLiteral)0x3fa7ef);
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)&wallets,(tinyformat *)&log_msg,fmt,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        (**(code **)(*(long *)pCVar8 + 0x130))(pCVar8,&wallets);
        bilingual_str::~bilingual_str((bilingual_str *)&wallets);
        bilingual_str::~bilingual_str((bilingual_str *)&log_msg);
      }
      else {
        wallets._0_8_ = wallets._0_8_ & 0xffffffffffff0000;
        wallets.val._M_dataplus._M_p = wallets.val._M_dataplus._M_p & 0xffffffffffffff00;
        wallets.val._M_string_length = 0;
        wallets.val.field_2._M_allocated_capacity = (size_type)&wallets.keys;
        wallets.val.field_2._8_8_ = 0;
        wallets.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
        wallets.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 1;
        wallets.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
        wallets.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x64;
        ReadDatabaseArgs(this_01,(DatabaseOptions *)&wallets);
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        wallets.typ._0_1_ = 1;
        wallets.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
        log_msg.field_2._M_allocated_capacity =
             log_msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_e0._0_8_ = 0;
        local_e0[8] = '\0';
        this = (char *)&status_1;
        MakeWalletDatabase((wallet *)&wallet_dir,(string *)fmt,(DatabaseOptions *)&wallets,
                           (DatabaseStatus *)this,(bilingual_str *)&log_msg);
        if (wallet_dir.super_path._M_pathname._M_dataplus._M_p == (pointer)0x0) {
          if (status_1 != FAILED_NOT_FOUND) {
            (**(code **)(*(long *)pCVar8 + 0x138))(pCVar8,&log_msg);
            bilingual_str::~bilingual_str((bilingual_str *)&log_msg);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::
            ~basic_string((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
                          &wallets.val.field_2);
            std::filesystem::__cxx11::path::~path((path *)&status);
            break;
          }
          tinyformat::format<std::__cxx11::string>
                    ((string *)&stack0xfffffffffffffd68,
                     (tinyformat *)"Skipping -wallet path that doesn\'t exist. %s",(char *)&log_msg,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
          original._M_string_length = (size_type)in_stack_fffffffffffffd20;
          original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd18;
          original.field_2._M_allocated_capacity = in_stack_fffffffffffffd28;
          original.field_2._8_4_ = in_stack_fffffffffffffd30;
          original.field_2._12_4_ = in_stack_fffffffffffffd34;
          Untranslated((bilingual_str *)&wallet_dir,original);
          (**(code **)(*(long *)pCVar8 + 0x130))(pCVar8,(bilingual_str *)&wallet_dir);
          bilingual_str::~bilingual_str((bilingual_str *)&wallet_dir);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
        }
        else {
          (**(code **)(*(long *)wallet_dir.super_path._M_pathname._M_dataplus._M_p + 8))();
        }
        bilingual_str::~bilingual_str((bilingual_str *)&log_msg);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
                      &wallets.val.field_2);
      }
      std::filesystem::__cxx11::path::~path((path *)&status);
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)&error);
    std::
    _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
    ::~_Rb_tree(&wallet_paths._M_t);
    goto LAB_001c88a5;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"-walletdir",(allocator<char> *)&log_msg);
  this = (char *)&wallets;
  wallets.val._M_string_length = 0;
  wallets.val.field_2._M_allocated_capacity = 0;
  wallets.typ = VNULL;
  wallets._4_4_ = 0;
  wallets.val._M_dataplus._M_p = (pointer)0x0;
  wallets.val.field_2._8_8_ = 0;
  std::filesystem::__cxx11::path::path((path *)this);
  arg._M_string_length = (size_type)in_stack_fffffffffffffd20;
  arg._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd18;
  arg.field_2._M_allocated_capacity = in_stack_fffffffffffffd28;
  arg.field_2._8_4_ = in_stack_fffffffffffffd30;
  arg.field_2._12_4_ = in_stack_fffffffffffffd34;
  ArgsManager::GetPathArg(&wallet_dir,this_01,arg,(path *)local_78);
  std::filesystem::__cxx11::path::~path((path *)&wallets);
  std::__cxx11::string::~string((string *)local_78);
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::canonical(&local_a0,(error_code *)&wallet_dir);
  std::filesystem::__cxx11::path::path((path *)&wallet_paths,(path *)&local_a0);
  std::filesystem::__cxx11::path::~path((path *)&local_a0);
  if (error._M_value == 0) {
    bVar2 = std::filesystem::exists((path *)&wallet_paths);
    if (!bVar2) goto LAB_001c84bd;
    bVar2 = std::filesystem::is_directory((path *)&wallet_paths);
    if (bVar2) {
      cVar3 = std::filesystem::__cxx11::path::has_root_directory();
      if (cVar3 != '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&wallets,"-walletdir",(allocator<char> *)&status);
        std::filesystem::__cxx11::path::string(&log_msg,(path *)&wallet_paths);
        ArgsManager::ForceSetArg(this_01,(string *)&wallets,&log_msg);
        std::__cxx11::string::~string((string *)&log_msg);
        std::__cxx11::string::~string((string *)&wallets);
        std::filesystem::__cxx11::path::~path((path *)&wallet_paths);
        std::filesystem::__cxx11::path::~path(&wallet_dir.super_path);
        goto LAB_001c816f;
      }
      _((bilingual_str *)&log_msg,(ConstevalStringLiteral)0x3fa6fe);
      std::filesystem::__cxx11::path::string((string *)&status,&wallet_dir.super_path);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)&wallets,(tinyformat *)&log_msg,(bilingual_str *)&status,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      (**(code **)(*(long *)pCVar8 + 0x138))(pCVar8,&wallets);
    }
    else {
      _((bilingual_str *)&log_msg,(ConstevalStringLiteral)0x3fa6d1);
      std::filesystem::__cxx11::path::string((string *)&status,&wallet_dir.super_path);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)&wallets,(tinyformat *)&log_msg,(bilingual_str *)&status,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      (**(code **)(*(long *)pCVar8 + 0x138))(pCVar8,&wallets);
    }
  }
  else {
LAB_001c84bd:
    _((bilingual_str *)&log_msg,(ConstevalStringLiteral)0x3fa6a8);
    std::filesystem::__cxx11::path::string((string *)&status,&wallet_dir.super_path);
    tinyformat::format<std::__cxx11::string>
              ((bilingual_str *)&wallets,(tinyformat *)&log_msg,(bilingual_str *)&status,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    (**(code **)(*(long *)pCVar8 + 0x138))(pCVar8,&wallets);
  }
  bilingual_str::~bilingual_str((bilingual_str *)&wallets);
  std::__cxx11::string::~string((string *)&status);
  bilingual_str::~bilingual_str((bilingual_str *)&log_msg);
  std::filesystem::__cxx11::path::~path((path *)&wallet_paths);
  std::filesystem::__cxx11::path::~path(&wallet_dir.super_path);
  uVar6 = 0;
LAB_001c88a5:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)uVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool VerifyWallets(WalletContext& context)
{
    interfaces::Chain& chain = *context.chain;
    ArgsManager& args = *Assert(context.args);

    if (args.IsArgSet("-walletdir")) {
        const fs::path wallet_dir{args.GetPathArg("-walletdir")};
        std::error_code error;
        // The canonical path cleans the path, preventing >1 Berkeley environment instances for the same directory
        // It also lets the fs::exists and fs::is_directory checks below pass on windows, since they return false
        // if a path has trailing slashes, and it strips trailing slashes.
        fs::path canonical_wallet_dir = fs::canonical(wallet_dir, error);
        if (error || !fs::exists(canonical_wallet_dir)) {
            chain.initError(strprintf(_("Specified -walletdir \"%s\" does not exist"), fs::PathToString(wallet_dir)));
            return false;
        } else if (!fs::is_directory(canonical_wallet_dir)) {
            chain.initError(strprintf(_("Specified -walletdir \"%s\" is not a directory"), fs::PathToString(wallet_dir)));
            return false;
        // The canonical path transforms relative paths into absolute ones, so we check the non-canonical version
        } else if (!wallet_dir.is_absolute()) {
            chain.initError(strprintf(_("Specified -walletdir \"%s\" is a relative path"), fs::PathToString(wallet_dir)));
            return false;
        }
        args.ForceSetArg("-walletdir", fs::PathToString(canonical_wallet_dir));
    }

    LogPrintf("Using wallet directory %s\n", fs::PathToString(GetWalletDir()));

    chain.initMessage(_("Verifying wallet(s)…").translated);

    // For backwards compatibility if an unnamed top level wallet exists in the
    // wallets directory, include it in the default list of wallets to load.
    if (!args.IsArgSet("wallet")) {
        DatabaseOptions options;
        DatabaseStatus status;
        ReadDatabaseArgs(args, options);
        bilingual_str error_string;
        options.require_existing = true;
        options.verify = false;
        if (MakeWalletDatabase("", options, status, error_string)) {
            common::SettingsValue wallets(common::SettingsValue::VARR);
            wallets.push_back(""); // Default wallet name is ""
            // Pass write=false because no need to write file and probably
            // better not to. If unnamed wallet needs to be added next startup
            // and the setting is empty, this code will just run again.
            chain.overwriteRwSetting("wallet", wallets, /*write=*/false);
        }
    }

    // Keep track of each wallet absolute path to detect duplicates.
    std::set<fs::path> wallet_paths;

    for (const auto& wallet : chain.getSettingsList("wallet")) {
        if (!wallet.isStr()) {
            chain.initError(_("Invalid value detected for '-wallet' or '-nowallet'. "
                              "'-wallet' requires a string value, while '-nowallet' accepts only '1' to disable all wallets"));
            return false;
        }
        const auto& wallet_file = wallet.get_str();
        const fs::path path = fsbridge::AbsPathJoin(GetWalletDir(), fs::PathFromString(wallet_file));

        if (!wallet_paths.insert(path).second) {
            chain.initWarning(strprintf(_("Ignoring duplicate -wallet %s."), wallet_file));
            continue;
        }

        DatabaseOptions options;
        DatabaseStatus status;
        ReadDatabaseArgs(args, options);
        options.require_existing = true;
        options.verify = true;
        bilingual_str error_string;
        if (!MakeWalletDatabase(wallet_file, options, status, error_string)) {
            if (status == DatabaseStatus::FAILED_NOT_FOUND) {
                chain.initWarning(Untranslated(strprintf("Skipping -wallet path that doesn't exist. %s", error_string.original)));
            } else {
                chain.initError(error_string);
                return false;
            }
        }
    }

    return true;
}